

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O2

int Cba_NtkFindMissing(Vec_Int_t *vObjs,int nObjs)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *p;
  int iVar3;
  int iVar4;
  
  p = Vec_IntStartFull(nObjs + 1);
  for (iVar3 = 0; iVar3 < vObjs->nSize; iVar3 = iVar3 + 1) {
    iVar1 = Vec_IntEntry(vObjs,iVar3);
    Vec_IntWriteEntry(p,iVar1,iVar3);
  }
  iVar3 = p->nSize;
  iVar1 = 1;
  while ((iVar4 = -1, iVar1 < iVar3 && (iVar2 = Vec_IntEntry(p,iVar1), iVar4 = iVar1, iVar2 != -1)))
  {
    iVar1 = iVar1 + 1;
  }
  Vec_IntFree(p);
  return iVar4;
}

Assistant:

int Cba_NtkFindMissing( Vec_Int_t * vObjs, int nObjs )
{
    Vec_Int_t * vMap = Vec_IntStartFull( nObjs + 1 );
    int i, iObj;
    Vec_IntForEachEntry( vObjs, iObj, i )
        Vec_IntWriteEntry( vMap, iObj, i );
    Vec_IntForEachEntryStart( vMap, i, iObj, 1 )
        if ( i == -1 )
        {
            Vec_IntFree( vMap );
            return iObj;
        }
    Vec_IntFree( vMap );
    return -1;
}